

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::DrawAndCheck<double>
          (AttributeFormatTest *this,GLint size,bool normalized)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *__src;
  size_t sVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  string result_str;
  string reference_str;
  double reference [8];
  double result [8];
  stringstream ss;
  long *local_320 [2];
  long local_310 [2];
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0;
  long local_2d0 [2];
  AttributeFormatTest *local_2c0;
  double local_2b8 [17];
  long local_230;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  _func_int **local_1b0;
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar9 + 0x1680))(this->m_po);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91b);
  local_2c0 = this;
  (**(code **)(lVar9 + 0xd8))(this->m_vao);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91e);
  (**(code **)(lVar9 + 0x30))(0);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x922);
  (**(code **)(lVar9 + 0x538))(0,0,2);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x925);
  (**(code **)(lVar9 + 0x638))();
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x928);
  __src = (void *)(**(code **)(lVar9 + 0xcf8))(0x8c8e,35000);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x92c);
  local_2b8[0xe] = 0.0;
  local_2b8[0xf] = 0.0;
  local_2b8[0xc] = 0.0;
  local_2b8[0xd] = 0.0;
  local_2b8[10] = 0.0;
  local_2b8[0xb] = 0.0;
  local_2b8[8] = 0.0;
  local_2b8[9] = 0.0;
  uVar1 = size * 2;
  uVar11 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    memcpy(local_2b8 + 8,__src,uVar11 * 8);
  }
  (**(code **)(lVar9 + 0x1670))(0x8c8e);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x936);
  if (normalized) {
    uVar13 = 0x3fb00000;
  }
  else {
    uVar13 = 0x3ff00000;
  }
  local_2b8[0x10] = 0.0;
  local_230 = (ulong)uVar13 << 0x20;
  local_228 = (double)((ulong)uVar13 << 0x20) * 2.0;
  dStack_220 = (double)((ulong)uVar13 << 0x20) * 3.0;
  local_218 = (double)((ulong)uVar13 << 0x20) * 4.0;
  dStack_210 = (double)((ulong)uVar13 << 0x20) * 5.0;
  local_208 = (double)((ulong)uVar13 << 0x20) * 6.0;
  dStack_200 = (double)((ulong)uVar13 << 0x20) * 7.0;
  local_1f8 = (double)((ulong)uVar13 << 0x20) * 8.0;
  dStack_1f0 = (double)((ulong)uVar13 << 0x20) * 9.0;
  local_1e8 = (double)((ulong)uVar13 << 0x20) * 10.0;
  dStack_1e0 = (double)((ulong)uVar13 << 0x20) * 11.0;
  local_1d8 = (double)((ulong)uVar13 << 0x20) * 12.0;
  dStack_1d0 = (double)((ulong)uVar13 << 0x20) * 13.0;
  dVar15 = (double)((ulong)uVar13 << 0x20) * 15.0;
  local_1c8._8_4_ = SUB84(dVar15,0);
  local_1c8._0_8_ = (double)((ulong)uVar13 << 0x20) * 14.0;
  local_1c8._12_4_ = (int)((ulong)dVar15 >> 0x20);
  local_2b8[6] = 0.0;
  local_2b8[7] = 0.0;
  local_2b8[4] = 0.0;
  local_2b8[5] = 0.0;
  local_2b8[2] = 0.0;
  local_2b8[3] = 0.0;
  local_2b8[0] = 0.0;
  local_2b8[1] = 0.0;
  lVar9 = 0;
  bVar12 = true;
  do {
    bVar6 = bVar12;
    if (0 < size) {
      iVar3 = size * (int)lVar9 * 2;
      lVar7 = lVar9 * ((ulong)(uint)size << 0x20);
      iVar8 = ((int)lVar9 * 2 + 1) * size;
      uVar10 = (ulong)(uint)size;
      do {
        *(double *)((long)local_2b8 + (lVar7 >> 0x1d)) =
             local_2b8[(long)iVar3 + 0x10] + local_2b8[(long)iVar8 + 0x10];
        lVar7 = lVar7 + 0x100000000;
        iVar8 = iVar8 + 1;
        iVar3 = iVar3 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    lVar9 = 1;
    bVar12 = false;
  } while (bVar6);
  bVar12 = true;
  if (0 < (int)uVar1) {
    dVar15 = local_2b8[0] - local_2b8[8];
    dVar14 = -dVar15;
    if (-dVar15 <= dVar15) {
      dVar14 = dVar15;
    }
    if (0.03125 <= dVar14) {
      bVar12 = false;
    }
    else {
      uVar10 = 0;
      do {
        if (uVar11 - 1 == uVar10) {
          return true;
        }
        dVar14 = local_2b8[uVar10 + 1] - local_2b8[uVar10 + 9];
        dVar15 = -dVar14;
        if (-dVar14 <= dVar14) {
          dVar15 = dVar14;
        }
        uVar10 = uVar10 + 1;
      } while (dVar15 < 0.03125);
      bVar12 = uVar11 <= uVar10;
    }
    local_300[0] = local_2f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"[ ","");
    uVar10 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::_M_insert<double>(local_2b8[uVar10]);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_300,(ulong)local_320[0]);
      if (local_320[0] != local_310) {
        operator_delete(local_320[0],local_310[0] + 1);
      }
      std::__cxx11::string::append((char *)local_300);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    local_320[0] = local_310;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"[ ","");
    uVar10 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::_M_insert<double>(local_2b8[uVar10 + 8]);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_320,(ulong)local_2e0);
      if (local_2e0 != local_2d0) {
        operator_delete(local_2e0,local_2d0[0] + 1);
      }
      std::__cxx11::string::append((char *)local_320);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    local_1b8 = (undefined1  [8])((local_2c0->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Result vector is equal to ",0x1a);
    plVar2 = local_320[0];
    iVar3 = (int)(ostringstream *)&local_1b0;
    if (local_320[0] == (long *)0x0) {
      std::ios::clear(iVar3 + (int)local_1b0[-3]);
    }
    else {
      sVar5 = strlen((char *)local_320[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)plVar2,sVar5)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,", but ",6);
    plVar2 = local_300[0];
    if (local_300[0] == (long *)0x0) {
      std::ios::clear(iVar3 + (int)local_1b0[-3]);
    }
    else {
      sVar5 = strlen((char *)local_300[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)plVar2,sVar5)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0," was expected.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    if (local_320[0] != local_310) {
      operator_delete(local_320[0],local_310[0] + 1);
    }
    if (local_300[0] != local_2f0) {
      operator_delete(local_300[0],local_2f0[0] + 1);
    }
  }
  return bVar12;
}

Assistant:

bool AttributeFormatTest::DrawAndCheck(glw::GLint size, bool normalized)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Draw. */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	T* result_ptr = (T*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	T result[8] = { 0 };

	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		result[i] = result_ptr[i];
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	const glw::GLdouble scale = normalized ? (1.0 / 16.0) /* Floating point scalling factor. */ : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	T reference[8] = { 0 };

	for (glw::GLint i = 0; i < 2 /* two points */; ++i)
	{
		for (glw::GLint j = 0; j < size /* size components */; ++j)
		{
			reference[i * size + j] = array_data[i * size * 2 + j] + array_data[i * size * 2 + j + size];
		}
	}

	/* Check result and return. */
	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		if (!AttributeFormatTest::compare<T>(reference[i], result[i]))
		{
			std::string reference_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << reference[j];

				reference_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					reference_str.append(", ");
				}
				else
				{
					reference_str.append(" ]");
				}
			}

			std::string result_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << result[j];

				result_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					result_str.append(", ");
				}
				else
				{
					result_str.append(" ]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to "
												<< result_str.c_str() << ", but " << reference_str.c_str()
												<< " was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}